

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClaus.c
# Opt level: O0

void Fra_ClausPrintIndClauses(Clu_Man_t *p)

{
  int iVar1;
  uint uVar2;
  uint local_4c;
  int i;
  int End;
  int Beg;
  int *pStart;
  int Counters [9];
  Clu_Man_t *p_local;
  
  unique0x10000205 = p;
  memset(&pStart,0,0x24);
  i = 0;
  Vec_IntArray(stack0xfffffffffffffff0->vLitsProven);
  for (local_4c = 0; iVar1 = Vec_IntSize(stack0xfffffffffffffff0->vClausesProven),
      (int)local_4c < iVar1; local_4c = local_4c + 1) {
    iVar1 = Vec_IntEntry(stack0xfffffffffffffff0->vClausesProven,local_4c);
    if (iVar1 - i < 8) {
      Counters[(long)(iVar1 - i) + -2] = Counters[(long)(iVar1 - i) + -2] + 1;
    }
    else {
      Counters[6] = Counters[6] + 1;
    }
    i = iVar1;
  }
  uVar2 = Vec_IntSize(stack0xfffffffffffffff0->vClausesProven);
  printf("SUMMARY: Total proved clauses = %d. ",(ulong)uVar2);
  printf("Clause per lit: ");
  for (local_4c = 0; (int)local_4c < 8; local_4c = local_4c + 1) {
    if (Counters[(long)(int)local_4c + -2] != 0) {
      printf("%d=%d ",(ulong)local_4c,(ulong)(uint)Counters[(long)(int)local_4c + -2]);
    }
  }
  if (Counters[6] != 0) {
    printf(">7=%d ",(ulong)(uint)Counters[6]);
  }
  printf("\n");
  return;
}

Assistant:

void Fra_ClausPrintIndClauses( Clu_Man_t * p )
{
    int Counters[9] = {0};
    int * pStart; 
    int Beg, End, i;
    Beg = 0;
    pStart = Vec_IntArray( p->vLitsProven );
    Vec_IntForEachEntry( p->vClausesProven, End, i )
    {
        if ( End - Beg >= 8 )
            Counters[8]++;
        else
            Counters[End - Beg]++;
//printf( "%d ", End-Beg );
        Beg = End;
    }
    printf( "SUMMARY: Total proved clauses = %d. ", Vec_IntSize(p->vClausesProven) );
    printf( "Clause per lit: " );
    for ( i = 0; i < 8; i++ )
        if ( Counters[i] )
            printf( "%d=%d ", i, Counters[i] );
    if ( Counters[8] )
            printf( ">7=%d ", Counters[8] );
    printf( "\n" );
}